

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

xmlRegexpPtr xmlRegEpxFromParse(xmlRegParserCtxtPtr ctxt)

{
  int iVar1;
  xmlRegAtomPtr pxVar2;
  xmlRegStatePtr *ppxVar3;
  xmlRegStatePtr pxVar4;
  xmlRegTrans *pxVar5;
  int *piVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  xmlRegexpPtr comp;
  xmlChar **ppxVar13;
  xmlChar **ppxVar14;
  xmlRegexpPtr pxVar15;
  xmlChar *pxVar16;
  int *__s;
  long lVar17;
  long lVar18;
  size_t __n;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  size_t __n_00;
  long lVar22;
  bool bVar23;
  void **local_88;
  
  comp = (xmlRegexpPtr)(*xmlMalloc)(0x68);
  if (comp == (xmlRegexpPtr)0x0) {
    ctxt->error = 2;
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xe,
                        (xmlError *)0x0);
    return (xmlRegexpPtr)0x0;
  }
  comp->transdata = (void **)0x0;
  *(undefined8 *)&comp->nbstrings = 0;
  *(undefined8 *)&comp->nbstates = 0;
  comp->compact = (int *)0x0;
  comp->counters = (xmlRegCounter *)0x0;
  comp->determinist = 0;
  comp->flags = 0;
  comp->atoms = (xmlRegAtomPtr *)0x0;
  *(undefined8 *)&comp->nbCounters = 0;
  comp->states = (xmlRegStatePtr *)0x0;
  *(undefined8 *)&comp->nbAtoms = 0;
  comp->string = (xmlChar *)0x0;
  *(undefined8 *)&comp->nbStates = 0;
  comp->stringMap = (xmlChar **)0x0;
  comp->string = ctxt->string;
  comp->nbStates = ctxt->nbStates;
  comp->states = ctxt->states;
  comp->nbAtoms = ctxt->nbAtoms;
  comp->atoms = ctxt->atoms;
  comp->nbCounters = ctxt->nbCounters;
  comp->counters = ctxt->counters;
  iVar9 = ctxt->determinist;
  comp->determinist = iVar9;
  comp->flags = ctxt->flags;
  if ((iVar9 == -1) && (iVar9 = xmlRegexpIsDeterminist(comp), iVar9 < 0)) {
    ctxt->error = 2;
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xe,
                        (xmlError *)0x0);
    (*xmlFree)(comp);
LAB_0017a642:
    comp = (xmlRegexpPtr)0x0;
  }
  else {
    if ((comp->determinist != 0) &&
       ((((comp->nbCounters == 0 && (ctxt->negs == 0)) && (comp->atoms != (xmlRegAtomPtr *)0x0)) &&
        ((pxVar2 = *comp->atoms, pxVar2 != (xmlRegAtomPtr)0x0 && (pxVar2->type == XML_REGEXP_STRING)
         ))))) {
      ppxVar13 = (xmlChar **)(*xmlMalloc)((long)comp->nbStates << 2);
      if (ppxVar13 == (xmlChar **)0x0) {
        ctxt->error = 2;
        xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xe,
                            (xmlError *)0x0);
LAB_0017ac2f:
        iVar11 = 1;
        pxVar15 = comp;
      }
      else {
        if (comp->nbStates < 1) {
          iVar9 = 0;
        }
        else {
          ppxVar3 = comp->states;
          lVar17 = 0;
          iVar9 = 0;
          do {
            if (ppxVar3[lVar17] == (xmlRegStatePtr)0x0) {
              *(undefined4 *)((long)ppxVar13 + lVar17 * 4) = 0xffffffff;
            }
            else {
              *(int *)((long)ppxVar13 + lVar17 * 4) = iVar9;
              iVar9 = iVar9 + 1;
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 < comp->nbStates);
        }
        ppxVar14 = (xmlChar **)(*xmlMalloc)((long)comp->nbAtoms << 3);
        if (ppxVar14 == (xmlChar **)0x0) {
          ctxt->error = 2;
          xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xe,
                              (xmlError *)0x0);
          (*xmlFree)(ppxVar13);
          goto LAB_0017ac2f;
        }
        pxVar15 = (xmlRegexpPtr)(*xmlMalloc)((long)comp->nbAtoms << 2);
        if (pxVar15 == (xmlRegexpPtr)0x0) {
          ctxt->error = 2;
          xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0xe,
                              (xmlError *)0x0);
LAB_0017a85c:
          (*xmlFree)(ppxVar14);
          ppxVar14 = ppxVar13;
LAB_0017ac2c:
          (*xmlFree)(ppxVar14);
          goto LAB_0017ac2f;
        }
        if (comp->nbAtoms < 1) {
          uVar19 = 0;
        }
        else {
          lVar17 = 0;
          uVar19 = 0;
          do {
            pxVar2 = comp->atoms[lVar17];
            if ((pxVar2->type != XML_REGEXP_STRING) || (pxVar2->quant != XML_REGEXP_QUANT_ONCE)) {
              (*xmlFree)(ppxVar13);
              (*xmlFree)(pxVar15);
              if (0 < (int)uVar19) {
                uVar20 = 0;
                do {
                  (*xmlFree)(ppxVar14[uVar20]);
                  uVar20 = uVar20 + 1;
                } while (uVar19 != uVar20);
              }
              goto LAB_0017ac2c;
            }
            pxVar16 = (xmlChar *)pxVar2->valuep;
            bVar23 = 0 < (int)uVar19;
            if ((int)uVar19 < 1) {
LAB_0017a7bd:
              *(uint *)((long)&pxVar15->string + lVar17 * 4) = uVar19;
              pxVar16 = xmlStrdup(pxVar16);
              ppxVar14[(int)uVar19] = pxVar16;
              if (pxVar16 != (xmlChar *)0x0) {
                uVar19 = uVar19 + 1;
                goto LAB_0017a7f0;
              }
              if (0 < (int)uVar19) {
                uVar20 = 0;
                do {
                  (*xmlFree)(ppxVar14[uVar20]);
                  uVar20 = uVar20 + 1;
                } while (uVar19 != uVar20);
              }
              (*xmlFree)(pxVar15);
              goto LAB_0017a85c;
            }
            iVar10 = xmlStrEqual(*ppxVar14,pxVar16);
            uVar20 = 0;
            if (iVar10 == 0) {
              uVar20 = 0;
              do {
                if ((ulong)uVar19 - 1 == uVar20) goto LAB_0017a7bd;
                iVar10 = xmlStrEqual(ppxVar14[uVar20 + 1],pxVar16);
                uVar20 = uVar20 + 1;
              } while (iVar10 == 0);
              bVar23 = uVar20 < uVar19;
            }
            *(int *)((long)&pxVar15->string + lVar17 * 4) = (int)uVar20;
            if (!bVar23) goto LAB_0017a7bd;
LAB_0017a7f0:
            lVar17 = lVar17 + 1;
          } while (lVar17 < comp->nbAtoms);
        }
        iVar10 = uVar19 + 1;
        if (iVar10 == 0) {
          __s = (int *)0x0;
        }
        else {
          __s = (int *)0x0;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = (long)iVar10;
          if ((ulong)(long)(iVar9 + 1) <=
              SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar7,0) >> 2) {
            __n_00 = (long)(iVar9 + 1) * (long)iVar10 * 4;
            __s = (int *)(*xmlMalloc)(__n_00);
            if (__s != (int *)0x0) {
              memset(__s,0,__n_00);
            }
          }
        }
        if (__s == (int *)0x0) {
          (*xmlFree)(ppxVar13);
          (*xmlFree)(pxVar15);
          if (0 < (int)uVar19) {
            uVar20 = 0;
            do {
              (*xmlFree)(ppxVar14[uVar20]);
              uVar20 = uVar20 + 1;
            } while (uVar19 != uVar20);
          }
          goto LAB_0017ac2c;
        }
        iVar21 = 0;
        if (0 < comp->nbStates) {
          __n = (long)iVar9 * (long)(int)uVar19 * 8;
          local_88 = (void **)0x0;
LAB_0017a967:
          iVar1 = *(int *)((long)ppxVar13 + (long)iVar21 * 4);
          if (iVar1 == -1) {
            iVar11 = 0x16;
          }
          else {
            pxVar4 = comp->states[iVar21];
            __s[iVar1 * iVar10] = pxVar4->type;
            iVar11 = 0;
            if (0 < pxVar4->nbTrans) {
              lVar17 = 8;
              lVar22 = 0;
LAB_0017a9be:
              pxVar5 = pxVar4->trans;
              if ((*(int *)((long)&pxVar5->atom + lVar17) < 0) ||
                 (piVar6 = *(int **)((long)pxVar5 + lVar17 + -8), piVar6 == (int *)0x0))
              goto LAB_0017aac3;
              iVar11 = *(int *)((long)&pxVar15->string + (long)*piVar6 * 4);
              if ((*(long *)(piVar6 + 0x16) != 0) && (local_88 == (void **)0x0)) {
                if (uVar19 == 0) {
                  local_88 = (void **)0x0;
                }
                else {
                  auVar8._8_8_ = 0;
                  auVar8._0_8_ = (long)(int)uVar19;
                  local_88 = (void **)0x0;
                  if (((ulong)(long)iVar9 <=
                       SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffffffffffff)) / auVar8,0) >> 3)
                     && (local_88 = (void **)(*xmlMalloc)(__n), local_88 != (void **)0x0)) {
                    memset(local_88,0,__n);
                  }
                }
                if (local_88 == (void **)0x0) {
                  ctxt->error = 2;
                  local_88 = (void **)0x0;
                  xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,
                                      (void *)0x0,0xe,(xmlError *)0x0);
                  iVar11 = 0;
                  goto LAB_0017abda;
                }
              }
              lVar18 = (long)(iVar1 * iVar10 + iVar11);
              iVar12 = *(int *)((long)ppxVar13 + (long)*(int *)((long)&pxVar5->atom + lVar17) * 4) +
                       1;
              if (__s[lVar18 + 1] == 0) {
                __s[lVar18 + 1] = iVar12;
                if (local_88 == (void **)0x0) {
                  local_88 = (void **)0x0;
                }
                else {
                  local_88[(int)(iVar11 + iVar1 * uVar19)] =
                       *(void **)(*(long *)((long)pxVar5 + lVar17 + -8) + 0x58);
                }
                goto LAB_0017aac3;
              }
              if (__s[lVar18 + 1] == iVar12) goto LAB_0017aac3;
              comp->determinist = 0;
              if (local_88 != (void **)0x0) {
                (*xmlFree)(local_88);
              }
              (*xmlFree)(__s);
              (*xmlFree)(ppxVar13);
              (*xmlFree)(pxVar15);
              uVar20 = 0;
              if (0 < (int)uVar19) {
                do {
                  (*xmlFree)(ppxVar14[uVar20]);
                  uVar20 = uVar20 + 1;
                } while (uVar19 != uVar20);
              }
              iVar21 = (int)uVar20;
              (*xmlFree)(ppxVar14);
              iVar11 = 0x1d;
            }
          }
          goto LAB_0017abda;
        }
        local_88 = (void **)0x0;
LAB_0017ac5b:
        comp->determinist = 1;
        if (comp->states != (xmlRegStatePtr *)0x0) {
          if (0 < comp->nbStates) {
            lVar17 = 0;
            do {
              xmlRegFreeState(comp->states[lVar17]);
              lVar17 = lVar17 + 1;
            } while (lVar17 < comp->nbStates);
          }
          (*xmlFree)(comp->states);
        }
        comp->states = (xmlRegStatePtr *)0x0;
        comp->nbStates = 0;
        if (comp->atoms != (xmlRegAtomPtr *)0x0) {
          if (0 < comp->nbAtoms) {
            lVar17 = 0;
            do {
              xmlRegFreeAtom(comp->atoms[lVar17]);
              lVar17 = lVar17 + 1;
            } while (lVar17 < comp->nbAtoms);
          }
          (*xmlFree)(comp->atoms);
        }
        comp->atoms = (xmlRegAtomPtr *)0x0;
        comp->nbAtoms = 0;
        comp->compact = __s;
        comp->transdata = local_88;
        comp->stringMap = ppxVar14;
        comp->nbstrings = uVar19;
        comp->nbstates = iVar9;
        (*xmlFree)(ppxVar13);
        iVar11 = 0;
      }
      (*xmlFree)(pxVar15);
LAB_0017ac42:
      if ((iVar11 != 0x1d) && (iVar11 != 0)) goto LAB_0017a642;
    }
    ctxt->string = (xmlChar *)0x0;
    ctxt->nbStates = 0;
    ctxt->states = (xmlRegStatePtr *)0x0;
    ctxt->nbAtoms = 0;
    ctxt->atoms = (xmlRegAtomPtr *)0x0;
    ctxt->nbCounters = 0;
    ctxt->counters = (xmlRegCounter *)0x0;
  }
  return comp;
LAB_0017aac3:
  lVar22 = lVar22 + 1;
  lVar17 = lVar17 + 0x18;
  if (pxVar4->nbTrans <= lVar22) goto code_r0x0017aad7;
  goto LAB_0017a9be;
code_r0x0017aad7:
  iVar11 = 0;
LAB_0017abda:
  if ((iVar11 != 0x16) && (iVar11 != 0)) goto LAB_0017ac42;
  iVar21 = iVar21 + 1;
  if (comp->nbStates <= iVar21) goto LAB_0017ac5b;
  goto LAB_0017a967;
}

Assistant:

static xmlRegexpPtr
xmlRegEpxFromParse(xmlRegParserCtxtPtr ctxt) {
    xmlRegexpPtr ret;

    ret = (xmlRegexpPtr) xmlMalloc(sizeof(xmlRegexp));
    if (ret == NULL) {
	xmlRegexpErrMemory(ctxt);
	return(NULL);
    }
    memset(ret, 0, sizeof(xmlRegexp));
    ret->string = ctxt->string;
    ret->nbStates = ctxt->nbStates;
    ret->states = ctxt->states;
    ret->nbAtoms = ctxt->nbAtoms;
    ret->atoms = ctxt->atoms;
    ret->nbCounters = ctxt->nbCounters;
    ret->counters = ctxt->counters;
    ret->determinist = ctxt->determinist;
    ret->flags = ctxt->flags;
    if (ret->determinist == -1) {
        if (xmlRegexpIsDeterminist(ret) < 0) {
            xmlRegexpErrMemory(ctxt);
            xmlFree(ret);
            return(NULL);
        }
    }

    if ((ret->determinist != 0) &&
	(ret->nbCounters == 0) &&
	(ctxt->negs == 0) &&
	(ret->atoms != NULL) &&
	(ret->atoms[0] != NULL) &&
	(ret->atoms[0]->type == XML_REGEXP_STRING)) {
	int i, j, nbstates = 0, nbatoms = 0;
	int *stateRemap;
	int *stringRemap;
	int *transitions;
	void **transdata;
	xmlChar **stringMap;
        xmlChar *value;

	/*
	 * Switch to a compact representation
	 * 1/ counting the effective number of states left
	 * 2/ counting the unique number of atoms, and check that
	 *    they are all of the string type
	 * 3/ build a table state x atom for the transitions
	 */

	stateRemap = xmlMalloc(ret->nbStates * sizeof(int));
	if (stateRemap == NULL) {
	    xmlRegexpErrMemory(ctxt);
	    xmlFree(ret);
	    return(NULL);
	}
	for (i = 0;i < ret->nbStates;i++) {
	    if (ret->states[i] != NULL) {
		stateRemap[i] = nbstates;
		nbstates++;
	    } else {
		stateRemap[i] = -1;
	    }
	}
	stringMap = xmlMalloc(ret->nbAtoms * sizeof(char *));
	if (stringMap == NULL) {
	    xmlRegexpErrMemory(ctxt);
	    xmlFree(stateRemap);
	    xmlFree(ret);
	    return(NULL);
	}
	stringRemap = xmlMalloc(ret->nbAtoms * sizeof(int));
	if (stringRemap == NULL) {
	    xmlRegexpErrMemory(ctxt);
	    xmlFree(stringMap);
	    xmlFree(stateRemap);
	    xmlFree(ret);
	    return(NULL);
	}
	for (i = 0;i < ret->nbAtoms;i++) {
	    if ((ret->atoms[i]->type == XML_REGEXP_STRING) &&
		(ret->atoms[i]->quant == XML_REGEXP_QUANT_ONCE)) {
		value = ret->atoms[i]->valuep;
                for (j = 0;j < nbatoms;j++) {
		    if (xmlStrEqual(stringMap[j], value)) {
			stringRemap[i] = j;
			break;
		    }
		}
		if (j >= nbatoms) {
		    stringRemap[i] = nbatoms;
		    stringMap[nbatoms] = xmlStrdup(value);
		    if (stringMap[nbatoms] == NULL) {
			for (i = 0;i < nbatoms;i++)
			    xmlFree(stringMap[i]);
			xmlFree(stringRemap);
			xmlFree(stringMap);
			xmlFree(stateRemap);
			xmlFree(ret);
			return(NULL);
		    }
		    nbatoms++;
		}
	    } else {
		xmlFree(stateRemap);
		xmlFree(stringRemap);
		for (i = 0;i < nbatoms;i++)
		    xmlFree(stringMap[i]);
		xmlFree(stringMap);
		xmlFree(ret);
		return(NULL);
	    }
	}
	transitions = (int *) xmlRegCalloc2(nbstates + 1, nbatoms + 1,
                                            sizeof(int));
	if (transitions == NULL) {
	    xmlFree(stateRemap);
	    xmlFree(stringRemap);
            for (i = 0;i < nbatoms;i++)
		xmlFree(stringMap[i]);
	    xmlFree(stringMap);
	    xmlFree(ret);
	    return(NULL);
	}

	/*
	 * Allocate the transition table. The first entry for each
	 * state corresponds to the state type.
	 */
	transdata = NULL;

	for (i = 0;i < ret->nbStates;i++) {
	    int stateno, atomno, targetno, prev;
	    xmlRegStatePtr state;
	    xmlRegTransPtr trans;

	    stateno = stateRemap[i];
	    if (stateno == -1)
		continue;
	    state = ret->states[i];

	    transitions[stateno * (nbatoms + 1)] = state->type;

	    for (j = 0;j < state->nbTrans;j++) {
		trans = &(state->trans[j]);
		if ((trans->to < 0) || (trans->atom == NULL))
		    continue;
                atomno = stringRemap[trans->atom->no];
		if ((trans->atom->data != NULL) && (transdata == NULL)) {
		    transdata = (void **) xmlRegCalloc2(nbstates, nbatoms,
			                                sizeof(void *));
		    if (transdata == NULL) {
			xmlRegexpErrMemory(ctxt);
			break;
		    }
		}
		targetno = stateRemap[trans->to];
		/*
		 * if the same atom can generate transitions to 2 different
		 * states then it means the automata is not deterministic and
		 * the compact form can't be used !
		 */
		prev = transitions[stateno * (nbatoms + 1) + atomno + 1];
		if (prev != 0) {
		    if (prev != targetno + 1) {
			ret->determinist = 0;
			if (transdata != NULL)
			    xmlFree(transdata);
			xmlFree(transitions);
			xmlFree(stateRemap);
			xmlFree(stringRemap);
			for (i = 0;i < nbatoms;i++)
			    xmlFree(stringMap[i]);
			xmlFree(stringMap);
			goto not_determ;
		    }
		} else {
		    transitions[stateno * (nbatoms + 1) + atomno + 1] =
			targetno + 1; /* to avoid 0 */
		    if (transdata != NULL)
			transdata[stateno * nbatoms + atomno] =
			    trans->atom->data;
		}
	    }
	}
	ret->determinist = 1;
	/*
	 * Cleanup of the old data
	 */
	if (ret->states != NULL) {
	    for (i = 0;i < ret->nbStates;i++)
		xmlRegFreeState(ret->states[i]);
	    xmlFree(ret->states);
	}
	ret->states = NULL;
	ret->nbStates = 0;
	if (ret->atoms != NULL) {
	    for (i = 0;i < ret->nbAtoms;i++)
		xmlRegFreeAtom(ret->atoms[i]);
	    xmlFree(ret->atoms);
	}
	ret->atoms = NULL;
	ret->nbAtoms = 0;

	ret->compact = transitions;
	ret->transdata = transdata;
	ret->stringMap = stringMap;
	ret->nbstrings = nbatoms;
	ret->nbstates = nbstates;
	xmlFree(stateRemap);
	xmlFree(stringRemap);
    }
not_determ:
    ctxt->string = NULL;
    ctxt->nbStates = 0;
    ctxt->states = NULL;
    ctxt->nbAtoms = 0;
    ctxt->atoms = NULL;
    ctxt->nbCounters = 0;
    ctxt->counters = NULL;
    return(ret);
}